

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_lore_flags(parser *p)

{
  _Bool _Var1;
  void *pvVar2;
  char *pcVar3;
  char *local_30;
  char *s;
  char *flags;
  monster_lore *l;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if ((pvVar2 != (void *)0x0) && (_Var1 = parser_hasval(p,"flags"), _Var1)) {
    pcVar3 = parser_getstr(p,"flags");
    pcVar3 = string_make(pcVar3);
    local_30 = strtok(pcVar3," |");
    while (local_30 != (char *)0x0) {
      grab_flag((bitflag *)((long)pvVar2 + 0x20),0xc,r_info_flags,local_30);
      local_30 = strtok((char *)0x0," |");
    }
    mem_free(pcVar3);
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_lore_flags(struct parser *p) {
	struct monster_lore *l = parser_priv(p);
	char *flags;
	char *s;

	if (!l)
		return PARSE_ERROR_NONE;
	if (!parser_hasval(p, "flags"))
		return PARSE_ERROR_NONE;
	flags = string_make(parser_getstr(p, "flags"));
	s = strtok(flags, " |");
	while (s) {
		(void) grab_flag(l->flags, RF_SIZE, r_info_flags, s);
		s = strtok(NULL, " |");
	}

	mem_free(flags);
	return PARSE_ERROR_NONE;
}